

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_pspr.cpp
# Opt level: O0

void DoReadyWeaponToGeneric(AActor *self,int paramflags)

{
  ulong local_20;
  size_t i;
  int flags;
  int paramflags_local;
  AActor *self_local;
  
  i._0_4_ = 0;
  for (local_20 = 0; local_20 < 6; local_20 = local_20 + 1) {
    if ((paramflags & ButtonChecks[local_20].ReadyFlag) != 0) {
      i._0_4_ = ButtonChecks[local_20].StateFlag | (uint)i;
    }
  }
  if ((self != (AActor *)0x0) && (self->player != (player_t *)0x0)) {
    self->player->WeaponState = self->player->WeaponState | (ushort)(uint)i;
  }
  return;
}

Assistant:

void DoReadyWeaponToGeneric(AActor *self, int paramflags)
{
	int flags = 0;

	for (size_t i = 0; i < countof(ButtonChecks); ++i)
	{
		if (paramflags & ButtonChecks[i].ReadyFlag)
		{
			flags |= ButtonChecks[i].StateFlag;
		}
	}
	if (self != NULL && self->player != NULL)
	{
		self->player->WeaponState |= flags;
	}
}